

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_int> * __thiscall
kj::heapArray<int_const,int_const*>
          (Array<const_int> *__return_storage_ptr__,kj *this,int *begin,int *end)

{
  undefined1 local_40 [8];
  ArrayBuilder<const_int> builder;
  int *end_local;
  int *begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<int_const>
            ((ArrayBuilder<const_int> *)local_40,(kj *)((long)begin - (long)this >> 2),(size_t)begin
            );
  ArrayBuilder<int_const>::addAll<int_const*,false>
            ((ArrayBuilder<int_const> *)local_40,(int *)this,(int *)builder.disposer);
  ArrayBuilder<const_int>::finish(__return_storage_ptr__,(ArrayBuilder<const_int> *)local_40);
  ArrayBuilder<const_int>::~ArrayBuilder((ArrayBuilder<const_int> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}